

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.h
# Opt level: O0

fields absl::lts_20250127::time_internal::cctz::detail::impl::n_sec
                 (year_t y,diff_t m,diff_t d,diff_t hh,diff_t mm,diff_t ss)

{
  second_t ss_00;
  minute_t mm_00;
  long cd;
  fields fVar1;
  int_least64_t local_98;
  int_least8_t local_90;
  int_least8_t iStack_8f;
  int_least8_t iStack_8e;
  int_least8_t iStack_8d;
  int_least8_t iStack_8c;
  long local_88;
  diff_t cm;
  int_least8_t local_78;
  int_least8_t iStack_77;
  int_least8_t iStack_76;
  int_least8_t iStack_75;
  int_least8_t iStack_74;
  int_least64_t local_70;
  int_least8_t local_68;
  int_least8_t iStack_67;
  int_least8_t iStack_66;
  int_least8_t iStack_65;
  int_least8_t iStack_64;
  int_least64_t local_60;
  int_least8_t local_58;
  int_least8_t iStack_57;
  int_least8_t iStack_56;
  int_least8_t iStack_55;
  int_least8_t iStack_54;
  second_t sStack_48;
  month_t nm;
  day_t nd;
  hour_t nhh;
  minute_t nmm;
  second_t nss;
  diff_t ss_local;
  diff_t mm_local;
  diff_t hh_local;
  diff_t d_local;
  diff_t m_local;
  year_t y_local;
  int_least8_t local_10;
  int_least8_t iStack_f;
  int_least8_t iStack_e;
  int_least8_t iStack_d;
  int_least8_t iStack_c;
  undefined3 uStack_b;
  
  if ((ss < 0) || (0x3b < ss)) {
    local_88 = ss / 0x3c;
    _sStack_48 = ss % 0x3c;
    if (_sStack_48 < 0) {
      local_88 = local_88 + -1;
      _sStack_48 = _sStack_48 + 0x3c;
    }
    fVar1 = n_min(y,m,d,hh,mm / 0x3c + local_88 / 0x3c,mm % 0x3c + local_88 % 0x3c,sStack_48);
    local_98 = fVar1.y;
    y_local = local_98;
    _local_90 = fVar1._8_4_;
    local_10 = local_90;
    iStack_f = iStack_8f;
    iStack_e = iStack_8e;
    iStack_d = iStack_8d;
    iStack_8c = fVar1.ss;
    iStack_c = iStack_8c;
  }
  else {
    ss_00 = (second_t)ss;
    if ((mm < 0) || (0x3b < mm)) {
      fVar1 = n_min(y,m,d,hh,mm / 0x3c,mm % 0x3c,ss_00);
      cm = fVar1.y;
      y_local = cm;
      _local_78 = fVar1._8_4_;
      local_10 = local_78;
      iStack_f = iStack_77;
      iStack_e = iStack_76;
      iStack_d = iStack_75;
      iStack_74 = fVar1.ss;
      iStack_c = iStack_74;
    }
    else {
      mm_00 = (minute_t)mm;
      if ((hh < 0) || (0x17 < hh)) {
        cd = (hh / 6 + (hh >> 0x3f) >> 2) - (hh >> 0x3f);
        fVar1 = n_hour(y,m,d,cd,hh + cd * -0x18,mm_00,ss_00);
        local_70 = fVar1.y;
        y_local = local_70;
        _local_68 = fVar1._8_4_;
        local_10 = local_68;
        iStack_f = iStack_67;
        iStack_e = iStack_66;
        iStack_d = iStack_65;
        iStack_64 = fVar1.ss;
        iStack_c = iStack_64;
      }
      else if ((((d < 1) || (0x1c < d)) || (m < 1)) || (0xc < m)) {
        fVar1 = n_mon(y,m,d,0,(hour_t)hh,mm_00,ss_00);
        local_60 = fVar1.y;
        y_local = local_60;
        _local_58 = fVar1._8_4_;
        local_10 = local_58;
        iStack_f = iStack_57;
        iStack_e = iStack_56;
        iStack_d = iStack_55;
        iStack_54 = fVar1.ss;
        iStack_c = iStack_54;
      }
      else {
        hh_local._0_1_ = (day_t)d;
        d_local._0_1_ = (month_t)m;
        detail::fields::fields
                  ((fields *)&y_local,y,(month_t)d_local,(day_t)hh_local,(hour_t)hh,mm_00,ss_00);
      }
    }
  }
  fVar1.m = local_10;
  fVar1.d = iStack_f;
  fVar1.hh = iStack_e;
  fVar1.mm = iStack_d;
  fVar1.y = y_local;
  fVar1.ss = iStack_c;
  fVar1._13_3_ = uStack_b;
  return fVar1;
}

Assistant:

CONSTEXPR_F fields n_sec(year_t y, diff_t m, diff_t d, diff_t hh, diff_t mm,
                         diff_t ss) noexcept {
  // Optimization for when (non-constexpr) fields are already normalized.
  if (0 <= ss && ss < 60) {
    const second_t nss = static_cast<second_t>(ss);
    if (0 <= mm && mm < 60) {
      const minute_t nmm = static_cast<minute_t>(mm);
      if (0 <= hh && hh < 24) {
        const hour_t nhh = static_cast<hour_t>(hh);
        if (1 <= d && d <= 28 && 1 <= m && m <= 12) {
          const day_t nd = static_cast<day_t>(d);
          const month_t nm = static_cast<month_t>(m);
          return fields(y, nm, nd, nhh, nmm, nss);
        }
        return n_mon(y, m, d, 0, nhh, nmm, nss);
      }
      return n_hour(y, m, d, hh / 24, hh % 24, nmm, nss);
    }
    return n_min(y, m, d, hh, mm / 60, mm % 60, nss);
  }
  diff_t cm = ss / 60;
  ss %= 60;
  if (ss < 0) {
    cm -= 1;
    ss += 60;
  }
  return n_min(y, m, d, hh, mm / 60 + cm / 60, mm % 60 + cm % 60,
               static_cast<second_t>(ss));
}